

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var __thiscall
Js::TypedArray<short,_false,_true>::TypedXor
          (TypedArray<short,_false,_true> *this,uint32 accessIndex,Var value)

{
  Type puVar1;
  code *pcVar2;
  bool bVar3;
  int16 value_00;
  short sVar4;
  int iVar5;
  uint32 uVar6;
  ArrayBufferBase *pAVar7;
  undefined4 extraout_var;
  undefined4 *puVar8;
  ScriptContext *scriptContext_00;
  type result;
  type *buffer;
  ScriptContext *scriptContext;
  Var value_local;
  uint32 accessIndex_local;
  TypedArray<short,_false,_true> *this_local;
  Var local_10;
  
  pAVar7 = ArrayBufferParent::GetArrayBuffer((ArrayBufferParent *)this);
  if (pAVar7 != (ArrayBufferBase *)0x0) {
    pAVar7 = ArrayBufferParent::GetArrayBuffer((ArrayBufferParent *)this);
    iVar5 = (*(pAVar7->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x72])();
    if (CONCAT44(extraout_var,iVar5) != 0) goto LAB_013a1370;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar8 = 1;
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                              ,0xafa,"(GetArrayBuffer() && GetArrayBuffer()->GetBuffer())",
                              "GetArrayBuffer() && GetArrayBuffer()->GetBuffer()");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar8 = 0;
LAB_013a1370:
  uVar6 = ArrayObject::GetLength((ArrayObject *)this);
  if (uVar6 <= accessIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0xafa,"(accessIndex < GetLength())","accessIndex < GetLength()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  scriptContext_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  puVar1 = (this->super_TypedArrayBase).buffer;
  value_00 = JavascriptConversion::ToInt16(value,scriptContext_00);
  sVar4 = AtomicsOperations::Xor<short>((short *)(puVar1 + (ulong)accessIndex * 2),value_00);
  iVar5 = (int)sVar4;
  bVar3 = TaggedInt::IsOverflow(iVar5);
  if (bVar3) {
    local_10 = JavascriptNumber::NewInlined((double)iVar5,scriptContext_00);
  }
  else {
    local_10 = TaggedInt::ToVarUnchecked(iVar5);
  }
  return local_10;
}

Assistant:

VTableValue Int8Array::DummyVirtualFunctionToHinderLinkerICF()
    {
        return VTableValue::VtableInt8Array;
    }